

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

Option * __thiscall
CLI::App::add_option
          (App *this,string *option_name,callback_t *option_callback,string *option_description,
          bool defaulted,
          function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
          *func)

{
  pointer *ppuVar1;
  pointer pcVar2;
  iterator __position;
  pointer puVar3;
  __normal_iterator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_*,_std::vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>_>
  _Var4;
  Option *pOVar5;
  string *__rhs;
  OptionAlreadyAdded *pOVar6;
  unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_> *puVar7;
  __uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *this_00;
  Option myopt;
  string local_360;
  _Any_data local_340;
  code *local_330;
  _Any_data local_320;
  code *local_310;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  Option local_260;
  
  pcVar2 = (option_name->_M_dataplus)._M_p;
  local_2c0._M_dataplus._M_p = (pointer)&local_2c0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2c0,pcVar2,pcVar2 + option_name->_M_string_length);
  pcVar2 = (option_description->_M_dataplus)._M_p;
  local_2e0._M_dataplus._M_p = (pointer)&local_2e0.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_2e0,pcVar2,pcVar2 + option_description->_M_string_length);
  std::
  function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
              *)&local_320,option_callback);
  Option::Option(&local_260,&local_2c0,&local_2e0,(callback_t *)&local_320,this);
  if (local_310 != (code *)0x0) {
    (*local_310)(&local_320,&local_320,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e0._M_dataplus._M_p != &local_2e0.field_2) {
    operator_delete(local_2e0._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p);
  }
  _Var4 = ::std::
          __find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>*,std::vector<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>,std::allocator<std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>>>>,__gnu_cxx::__ops::_Iter_pred<CLI::App::add_option(std::__cxx11::string,std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)>,std::__cxx11::string,bool,std::function<std::__cxx11::string()>)::_lambda(std::unique_ptr<CLI::Option,std::default_delete<CLI::Option>>const&)_1_>>
                    ((this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     (this->options_).
                     super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_260);
  __position._M_current =
       (this->options_).
       super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var4._M_current == __position._M_current) {
    if (__position._M_current ==
        (this->options_).
        super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
      ::_M_realloc_insert<>(&this->options_,__position);
    }
    else {
      ((__position._M_current)->_M_t).
      super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
      super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
      super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl = (Option *)0x0;
      ppuVar1 = &(this->options_).
                 super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppuVar1 = *ppuVar1 + 1;
    }
    puVar3 = (this->options_).
             super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pOVar5 = (Option *)operator_new(0x230);
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    pcVar2 = (option_name->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_360,pcVar2,pcVar2 + option_name->_M_string_length);
    pcVar2 = (option_description->_M_dataplus)._M_p;
    local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_300,pcVar2,pcVar2 + option_description->_M_string_length);
    std::
    function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
    ::function((function<bool_(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                *)&local_340,option_callback);
    Option::Option(pOVar5,&local_360,&local_300,(callback_t *)&local_340,this);
    this_00 = (__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_> *)(puVar3 + -1);
    std::__uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>::reset(this_00,pOVar5);
    if (local_330 != (code *)0x0) {
      (*local_330)(&local_340,&local_340,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p);
    }
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>::
    operator=(&((this_00->_M_t).
                super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl)->default_function_,func);
    if (defaulted) {
      Option::capture_default_str
                ((this_00->_M_t).
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
    }
    OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
              (&(this->option_defaults_).super_OptionBase<CLI::OptionDefaults>,
               (this_00->_M_t).
               super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
               super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl);
    if ((!defaulted) &&
       (pOVar5 = (this_00->_M_t).
                 super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                 super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,
       (pOVar5->super_OptionBase<CLI::Option>).always_capture_default_ == true)) {
      Option::capture_default_str(pOVar5);
    }
    pOVar5 = (this_00->_M_t).
             super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
             super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl;
    Option::~Option(&local_260);
    return pOVar5;
  }
  puVar7 = (this->options_).
           super__Vector_base<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>,_std::allocator<std::unique_ptr<CLI::Option,_std::default_delete<CLI::Option>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (puVar7 != __position._M_current) {
    do {
      __rhs = Option::matching_name_abi_cxx11_
                        ((puVar7->_M_t).
                         super___uniq_ptr_impl<CLI::Option,_std::default_delete<CLI::Option>_>._M_t.
                         super__Tuple_impl<0UL,_CLI::Option_*,_std::default_delete<CLI::Option>_>.
                         super__Head_base<0UL,_CLI::Option_*,_false>._M_head_impl,&local_260);
      if (__rhs->_M_string_length != 0) {
        pOVar6 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        ::std::operator+(&local_280,"added option matched existing option name: ",__rhs);
        OptionAlreadyAdded::OptionAlreadyAdded(pOVar6,&local_280);
        __cxa_throw(pOVar6,&OptionAlreadyAdded::typeinfo,Error::~Error);
      }
      puVar7 = puVar7 + 1;
    } while (puVar7 != __position._M_current);
  }
  pOVar6 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2a0,"added option matched existing option name","");
  OptionAlreadyAdded::OptionAlreadyAdded(pOVar6,&local_2a0);
  __cxa_throw(pOVar6,&OptionAlreadyAdded::typeinfo,Error::~Error);
}

Assistant:

Option *add_option(std::string option_name,
                       callback_t option_callback,
                       std::string option_description = "",
                       bool defaulted = false,
                       std::function<std::string()> func = {}) {
        Option myopt{option_name, option_description, option_callback, this};

        if(std::find_if(std::begin(options_), std::end(options_), [&myopt](const Option_p &v) {
               return *v == myopt;
           }) == std::end(options_)) {
            options_.emplace_back();
            Option_p &option = options_.back();
            option.reset(new Option(option_name, option_description, option_callback, this));

            // Set the default string capture function
            option->default_function(func);

            // For compatibility with CLI11 1.7 and before, capture the default string here
            if(defaulted)
                option->capture_default_str();

            // Transfer defaults to the new option
            option_defaults_.copy_to(option.get());

            // Don't bother to capture if we already did
            if(!defaulted && option->get_always_capture_default())
                option->capture_default_str();

            return option.get();
        }
        // we know something matches now find what it is so we can produce more error information
        for(auto &opt : options_) {
            auto &matchname = opt->matching_name(myopt);
            if(!matchname.empty()) {
                throw(OptionAlreadyAdded("added option matched existing option name: " + matchname));
            }
        }
        // this line should not be reached the above loop should trigger the throw
        throw(OptionAlreadyAdded("added option matched existing option name"));  // LCOV_EXCL_LINE
    }